

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void RestoreModel(CPpmd8 *p,CTX_PTR c1)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  Byte BVar5;
  ushort uVar6;
  UInt32 UVar7;
  byte *ptr;
  CPpmd_State *s;
  CTX_PTR c;
  CTX_PTR c1_local;
  CPpmd8 *p_local;
  
  p->Text = p->Base + p->AlignOffset;
  s = (CPpmd_State *)p->MaxContext;
  while ((CTX_PTR)s != c1) {
    BVar5 = s->Symbol + 0xff;
    s->Symbol = BVar5;
    if (BVar5 == '\0') {
      ptr = p->Base + *(uint *)&s->SuccessorHigh;
      s->Freq = (s->Freq & 0x10) + (0x3f < *ptr) * '\b';
      uVar1 = *(undefined4 *)ptr;
      s->SuccessorLow = (short)uVar1;
      s->SuccessorHigh = (short)((uint)uVar1 >> 0x10);
      bVar4 = ptr[5];
      s[1].Symbol = ptr[4];
      s[1].Freq = bVar4;
      SpecialFreeUnit(p,ptr);
      *(char *)((long)&s->SuccessorLow + 1) =
           (char)(*(byte *)((long)&s->SuccessorLow + 1) + 0xb >> 3);
    }
    else {
      Refresh(p,(CTX_PTR)s,(int)(s->Symbol + 3) >> 1,0);
    }
    uVar2._0_2_ = s[1].SuccessorLow;
    uVar2._2_2_ = s[1].SuccessorHigh;
    s = (CPpmd_State *)(p->Base + uVar2);
  }
  while ((CPpmd8_Context *)s != p->MinContext) {
    if (s->Symbol == '\0') {
      *(char *)((long)&s->SuccessorLow + 1) =
           *(char *)((long)&s->SuccessorLow + 1) -
           (char)((int)(uint)*(byte *)((long)&s->SuccessorLow + 1) >> 1);
    }
    else {
      uVar6 = s->SuccessorLow + 4;
      s->SuccessorLow = uVar6;
      if ((ushort)((ushort)s->Symbol * 4 + 0x80) < uVar6) {
        Refresh(p,(CTX_PTR)s,(int)(s->Symbol + 2) >> 1,1);
      }
    }
    uVar3._0_2_ = s[1].SuccessorLow;
    uVar3._2_2_ = s[1].SuccessorHigh;
    s = (CPpmd_State *)(p->Base + uVar3);
  }
  if ((p->RestoreMethod == 0) || (UVar7 = GetUsedMemory(p), UVar7 < p->Size >> 1)) {
    RestartModel(p);
  }
  else {
    while (p->MaxContext->Suffix != 0) {
      p->MaxContext = (CPpmd8_Context *)(p->Base + p->MaxContext->Suffix);
    }
    do {
      CutOff(p,p->MaxContext,0);
      ExpandTextArea(p);
      UVar7 = GetUsedMemory(p);
    } while ((p->Size >> 2) * 3 < UVar7);
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
  return;
}

Assistant:

static void RestoreModel(CPpmd8 *p, CTX_PTR c1
    #ifdef PPMD8_FREEZE_SUPPORT
    , CTX_PTR fSuccessor
    #endif
    )
{
  CTX_PTR c;
  CPpmd_State *s;
  RESET_TEXT(0);
  for (c = p->MaxContext; c != c1; c = SUFFIX(c))
    if (--(c->NumStats) == 0)
    {
      s = STATS(c);
      c->Flags = (Byte)((c->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(c) = *s;
      SpecialFreeUnit(p, s);
      ONE_STATE(c)->Freq = (Byte)(((unsigned)ONE_STATE(c)->Freq + 11) >> 3);
    }
    else
      Refresh(p, c, (c->NumStats+3) >> 1, 0);
 
  for (; c != p->MinContext; c = SUFFIX(c))
    if (!c->NumStats)
      ONE_STATE(c)->Freq = (Byte)(ONE_STATE(c)->Freq - (ONE_STATE(c)->Freq >> 1));
    else if ((c->SummFreq += 4) > 128 + 4 * c->NumStats)
      Refresh(p, c, (c->NumStats + 2) >> 1, 1);

  #ifdef PPMD8_FREEZE_SUPPORT
  if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    p->MaxContext = fSuccessor;
    p->GlueCount += !(p->Stamps[1] & 1);
  }
  else if (p->RestoreMethod == PPMD8_RESTORE_METHOD_FREEZE)
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    RemoveBinContexts(p, p->MaxContext, 0);
    p->RestoreMethod++;
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
  else
  #endif
  if (p->RestoreMethod == PPMD8_RESTORE_METHOD_RESTART || GetUsedMemory(p) < (p->Size >> 1))
    RestartModel(p);
  else
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    do
    {
      CutOff(p, p->MaxContext, 0);
      ExpandTextArea(p);
    }
    while (GetUsedMemory(p) > 3 * (p->Size >> 2));
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
}